

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_prune.cpp
# Opt level: O2

bool __thiscall
PruneReplayer::enqueue_create_graphics_pipeline
          (PruneReplayer *this,Hash hash,VkGraphicsPipelineCreateInfo *create_info,
          VkPipeline *pipeline)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  size_type sVar4;
  VkPipelineLibraryCreateInfoKHR *pVVar5;
  iterator iVar6;
  mapped_type *ppVVar7;
  bool bVar8;
  VkPipeline *pNext;
  long lVar9;
  ulong uVar10;
  VkPipeline local_50;
  PruneReplayer *local_48;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>,_std::allocator<std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_40;
  Hash hash_local;
  
  *pipeline = (VkPipeline)hash;
  pNext = (VkPipeline *)0x6;
  hash_local = hash;
  bVar2 = filter_object(this,RESOURCE_GRAPHICS_PIPELINE,hash);
  if (bVar2) {
    lVar9 = 0x18;
    uVar10 = 0xffffffffffffffff;
    do {
      uVar3 = create_info->stageCount;
      uVar10 = uVar10 + 1;
      if (uVar3 <= uVar10) {
        bVar2 = false;
        goto LAB_001073a4;
      }
      pNext = *(VkPipeline **)((long)&create_info->pStages->sType + lVar9);
      lVar9 = lVar9 + 0x30;
      bVar2 = filter_shader_module(this,(Hash)pNext);
    } while (!bVar2);
    uVar3 = create_info->stageCount;
    bVar2 = true;
LAB_001073a4:
    if (uVar3 == 0) {
      bVar2 = true;
    }
    lVar9 = 0x18;
    uVar10 = 0xffffffffffffffff;
    do {
      uVar10 = uVar10 + 1;
      if (create_info->stageCount <= uVar10) goto LAB_001073fb;
      local_50 = *(VkPipeline *)((long)&create_info->pStages->sType + lVar9);
      lVar9 = lVar9 + 0x30;
      pNext = &local_50;
      sVar4 = std::
              _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count(&(this->banned_modules)._M_h,(key_type *)&local_50);
    } while (sVar4 == 0);
    bVar2 = false;
LAB_001073fb:
    pVVar5 = find_pnext<VkPipelineLibraryCreateInfoKHR>((VkStructureType)create_info->pNext,pNext);
    bVar8 = bVar2;
    if (pVVar5 != (VkPipelineLibraryCreateInfoKHR *)0x0) {
      local_40 = &(this->graphics_pipelines)._M_h;
      bVar1 = false;
      local_48 = this;
      for (uVar10 = 0; uVar10 < pVVar5->libraryCount; uVar10 = uVar10 + 1) {
        local_50 = pVVar5->pLibraries[uVar10];
        sVar4 = std::
                _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::count(&(this->banned_graphics)._M_h,(key_type *)&local_50);
        if (sVar4 != 0) {
          bVar2 = false;
          break;
        }
        if (!bVar1) {
          local_50 = pVVar5->pLibraries[uVar10];
          iVar6 = std::
                  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>,_std::allocator<std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(local_40,(key_type *)&local_50);
          if ((iVar6.
               super__Node_iterator_base<std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>,_false>
               ._M_cur != (__node_type *)0x0) &&
             (*(int *)(*(long *)((long)iVar6.
                                       super__Node_iterator_base<std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>,_false>
                                       ._M_cur + 0x10) + 0x14) != 0)) {
            bVar1 = true;
          }
        }
      }
      this = local_48;
      bVar8 = bVar2;
      if ((create_info->stageCount == 0) && (bVar8 = bVar1, !bVar2)) {
        bVar8 = bVar2;
      }
    }
    uVar3 = create_info->flags & 0x800;
    if ((uVar3 != 0) && (create_info->stageCount == 0)) {
      bVar8 = false;
    }
    lVar9 = 0x430;
    if (bVar8) goto LAB_001074e2;
  }
  else {
    uVar3 = create_info->flags & 0x800;
  }
  lVar9 = 0x4a0;
  if (uVar3 == 0) {
    return true;
  }
LAB_001074e2:
  ppVVar7 = std::__detail::
            _Map_base<unsigned_long,_std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>,_std::allocator<std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>,_std::allocator<std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)((long)&(this->super_StateCreatorInterface)._vptr_StateCreatorInterface
                            + lVar9),&hash_local);
  *ppVVar7 = create_info;
  return true;
}

Assistant:

bool enqueue_create_graphics_pipeline(Hash hash, const VkGraphicsPipelineCreateInfo *create_info, VkPipeline *pipeline) override
	{
		*pipeline = fake_handle<VkPipeline>(hash);
		bool allow_pipeline = false;

		if (filter_object(RESOURCE_GRAPHICS_PIPELINE, hash))
		{
			for (uint32_t i = 0; i < create_info->stageCount; i++)
			{
				if (filter_shader_module((Hash) create_info->pStages[i].module))
				{
					allow_pipeline = true;
					break;
				}
			}

			if (create_info->stageCount == 0)
				allow_pipeline = true;

			// Need to test this as well, if there is at least one banned module used, we don't allow the pipeline.
			for (uint32_t i = 0; i < create_info->stageCount; i++)
			{
				if (banned_modules.count((Hash) create_info->pStages[i].module))
				{
					allow_pipeline = false;
					break;
				}
			}

			auto *library_info =
					find_pnext<VkPipelineLibraryCreateInfoKHR>(VK_STRUCTURE_TYPE_PIPELINE_LIBRARY_CREATE_INFO_KHR,
					                                           create_info->pNext);

			if (library_info)
			{
				bool has_default_allowed_library = false;
				for (uint32_t i = 0; i < library_info->libraryCount; i++)
				{
					if (banned_graphics.count((Hash) library_info->pLibraries[i]))
					{
						allow_pipeline = false;
						break;
					}

					if (!has_default_allowed_library)
					{
						// Only consider libraries which contain modules.
						auto itr = graphics_pipelines.find((Hash) library_info->pLibraries[i]);
						if (itr != graphics_pipelines.end() && itr->second->stageCount != 0)
							has_default_allowed_library = true;
					}
				}

				// At least one of the dependent libraries must be considered allowed to pass.
				if (create_info->stageCount == 0 && allow_pipeline)
					allow_pipeline = has_default_allowed_library;
			}

			// Never include libraries by default unless they contain real code.
			if ((create_info->flags & VK_PIPELINE_CREATE_LIBRARY_BIT_KHR) != 0 && create_info->stageCount == 0)
				allow_pipeline = false;
		}

		// Need to defer this since we need to access pipeline libraries.
		if (allow_pipeline)
			graphics_pipelines[hash] = create_info;
		else if ((create_info->flags & VK_PIPELINE_CREATE_LIBRARY_BIT_KHR) != 0)
			library_graphics_pipelines[hash] = create_info;

		return true;
	}